

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O3

vector<KTX_header2,_std::allocator<KTX_header2>_> * __thiscall
ktx::CommandCompare::read<KTX_header2>
          (vector<KTX_header2,_std::allocator<KTX_header2>_> *__return_storage_ptr__,
          CommandCompare *this,InputStreams *streams,size_t offset,string_view what)

{
  bool bVar1;
  pointer __s;
  bool bVar2;
  value_type *__val;
  long lVar3;
  
  __s = (pointer)operator_new(0xa0);
  (__return_storage_ptr__->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
  super__Vector_impl_data._M_start = __s;
  (__return_storage_ptr__->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = __s + 2;
  lVar3 = 0;
  memset(__s,0,0xa0);
  (__return_storage_ptr__->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
  super__Vector_impl_data._M_finish = __s + 2;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    read(this,(int)lVar3 * 0x3b8 + (int)streams,(void *)offset,(size_t)(__s + lVar3));
    lVar3 = 1;
    bVar1 = false;
  } while (bVar2);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> read(InputStreams& streams, std::size_t offset, std::string_view what) {
        std::vector<T> result(streams.size());
        for (std::size_t i = 0; i < streams.size(); ++i) {
            read(streams[i], offset, &result[i], sizeof(T), what);
        }
        return result;
    }